

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *
llvm::cl::getRegisteredSubcommands(void)

{
  CommandLineParser *this;
  iterator_range<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>_> *in_RDI;
  
  this = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
         ::operator->(&GlobalParser);
  anon_unknown.dwarf_1c6cb7::CommandLineParser::getRegisteredSubcommands(in_RDI,this);
  return in_RDI;
}

Assistant:

iterator_range<typename SmallPtrSet<SubCommand *, 4>::iterator>
cl::getRegisteredSubcommands() {
  return GlobalParser->getRegisteredSubcommands();
}